

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i)

{
  int64_t iVar1;
  Matrix *this_00;
  Matrix *pMVar2;
  real *prVar3;
  reference pvVar4;
  long in_RDX;
  vector<float,_std::allocator<float>_> *in_RDI;
  int64_t j;
  undefined4 in_stack_ffffffffffffffb8;
  real in_stack_ffffffffffffffbc;
  int64_t in_stack_ffffffffffffffc0;
  Matrix *in_stack_ffffffffffffffc8;
  Matrix *local_20;
  
  if (in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                  ,0x40,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
  }
  iVar1 = Matrix::size(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (in_RDX < iVar1) {
    this_00 = (Matrix *)size((Vector *)0x19d4e6);
    pMVar2 = (Matrix *)Matrix::size(this_00,in_stack_ffffffffffffffc0);
    if (this_00 == pMVar2) {
      local_20 = (Matrix *)0x0;
      while( true ) {
        pMVar2 = local_20;
        iVar1 = Matrix::size(this_00,(int64_t)local_20);
        if (iVar1 <= (long)pMVar2) break;
        prVar3 = Matrix::at(pMVar2,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            0x19d56b);
        in_stack_ffffffffffffffbc = *prVar3;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(size_type)local_20);
        *pvVar4 = in_stack_ffffffffffffffbc + *pvVar4;
        local_20 = (Matrix *)
                   ((long)&(local_20->data_).super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1);
      }
      return;
    }
    __assert_fail("size() == A.size(1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                  ,0x42,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
  }
  __assert_fail("i < A.size(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                ,0x41,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i) {
  assert(i >= 0);
  assert(i < A.size(0));
  assert(size() == A.size(1));
  for (int64_t j = 0; j < A.size(1); j++) {
    data_[j] += A.at(i, j);
  }
}